

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_base.c
# Opt level: O3

int zt_base_decode(zt_base_definition_t *def,void *in,size_t in_bytes,void **out,size_t *out_bytes)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  uint buf [2];
  int local_58 [8];
  ulong *local_38;
  
  if (def == (zt_base_definition_t *)0x0) {
    return -1;
  }
  bVar1 = def->igroups;
  bVar2 = def->ogroups;
  if ((uint)bVar1 * 8 != (uint)def->obits * (uint)bVar2) {
    return -1;
  }
  if (out_bytes == (size_t *)0x0 || 8 < bVar1) {
    return -1;
  }
  if (in == (void *)0x0 || in_bytes == 0) {
    *out_bytes = 0;
  }
  else {
    lVar5 = in_bytes - 1;
    if (0 < lVar5) {
      lVar5 = 0;
      sVar9 = in_bytes;
      do {
        if ((uint)*(byte *)((long)in + (sVar9 - 1)) != (int)def->pad) goto LAB_00103d6c;
        lVar5 = lVar5 + 1;
        sVar9 = sVar9 - 1;
      } while (1 < (long)sVar9);
      lVar5 = 0;
    }
LAB_00103d6c:
    uVar6 = ((in_bytes - lVar5) / (ulong)bVar2) * (ulong)bVar1 + (in_bytes - lVar5) % (ulong)bVar2;
    if (out == (void **)0x0) {
      *out_bytes = uVar6;
    }
    else {
      pbVar4 = (byte *)*out;
      if (pbVar4 == (byte *)0x0) {
        if (*out_bytes == 0) {
          local_38 = out_bytes;
          pbVar4 = (byte *)zt_calloc_p(uVar6 + 1,1);
          if (pbVar4 == (byte *)0x0) {
            return -1;
          }
          *out = pbVar4;
          *local_38 = uVar6;
          out_bytes = local_38;
        }
        else {
          pbVar4 = (byte *)0x0;
        }
      }
      else if (*out_bytes < uVar6) {
        *out_bytes = uVar6;
        return -2;
      }
      sVar9 = def->base;
      if (sVar9 != 0x10) {
        if (sVar9 == 0x20) {
          sVar9 = 0;
          lVar5 = 0;
          uVar6 = 0;
          do {
            cVar3 = def->dictionary[*(byte *)((long)in + sVar9)];
            if (cVar3 < '\0') {
              if (cVar3 == -1) {
                return -1;
              }
            }
            else {
              local_58[lVar5] = (int)cVar3;
              lVar5 = lVar5 + 1;
              if (lVar5 == 8) {
                *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
                pbVar4[1] = (byte)((uint)local_58[3] >> 4) |
                            (char)local_58[2] * '\x02' | (byte)(local_58[1] << 6);
                pbVar4[2] = (byte)((uint)local_58[4] >> 1) | (byte)(local_58[3] << 4);
                pbVar4[3] = (byte)((uint)local_58[6] >> 3) |
                            (byte)(local_58[5] << 2) | (byte)(local_58[4] << 7);
                pbVar4[4] = (byte)(local_58[6] << 5) | (byte)local_58[7];
                pbVar4 = pbVar4 + 5;
                uVar6 = uVar6 + 5;
                lVar5 = 0;
              }
            }
            sVar9 = sVar9 + 1;
          } while (in_bytes != sVar9);
          iVar8 = 0;
          cVar3 = (char)local_58[2];
          iVar7 = 0;
          switch(lVar5) {
          case 0:
            break;
          default:
            iVar7 = -1;
            break;
          case 2:
            *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
            uVar6 = uVar6 + 1;
            iVar7 = iVar8;
            break;
          case 4:
            *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
            pbVar4[1] = (byte)((uint)local_58[3] >> 4) | cVar3 * '\x02' | (byte)(local_58[1] << 6);
            uVar6 = uVar6 + 2;
            iVar7 = iVar8;
            break;
          case 5:
            *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
            pbVar4[1] = (byte)((uint)local_58[3] >> 4) | cVar3 * '\x02' | (byte)(local_58[1] << 6);
            pbVar4[2] = (byte)((uint)local_58[4] >> 1) | (byte)(local_58[3] << 4);
            uVar6 = uVar6 + 3;
            iVar7 = iVar8;
            break;
          case 6:
            return -1;
          case 7:
            *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
            pbVar4[1] = (byte)((uint)local_58[3] >> 4) | cVar3 * '\x02' | (byte)(local_58[1] << 6);
            pbVar4[2] = (byte)((uint)local_58[4] >> 1) | (byte)(local_58[3] << 4);
            pbVar4[3] = (byte)((uint)local_58[6] >> 3) |
                        (byte)(local_58[5] << 2) | (byte)(local_58[4] << 7);
            uVar6 = uVar6 + 4;
            iVar7 = iVar8;
          }
        }
        else {
          if (sVar9 != 0x40) {
            return -1;
          }
          sVar9 = 0;
          lVar5 = 0;
          uVar6 = 0;
          do {
            cVar3 = def->dictionary[*(byte *)((long)in + sVar9)];
            if (cVar3 < '\0') {
              if (cVar3 == -1) {
                return -1;
              }
            }
            else {
              local_58[lVar5] = (int)cVar3;
              lVar5 = lVar5 + 1;
              if (lVar5 == 4) {
                *pbVar4 = (byte)((uint)local_58[1] >> 4) | (byte)(local_58[0] << 2);
                pbVar4[1] = (byte)((uint)local_58[2] >> 2) | (byte)(local_58[1] << 4);
                pbVar4[2] = (byte)(local_58[2] << 6) | (byte)local_58[3];
                pbVar4 = pbVar4 + 3;
                uVar6 = uVar6 + 3;
                lVar5 = 0;
              }
            }
            sVar9 = sVar9 + 1;
          } while (in_bytes != sVar9);
          iVar7 = 0;
          switch(lVar5) {
          case 0:
            goto switchD_00103e9f_caseD_0;
          case 1:
            iVar7 = -1;
            break;
          case 2:
            *pbVar4 = (byte)((uint)local_58[1] >> 4) | (byte)(local_58[0] << 2);
            break;
          case 3:
            *pbVar4 = (byte)((uint)local_58[1] >> 4) | (byte)(local_58[0] << 2);
            pbVar4[1] = (byte)((uint)local_58[2] >> 2) | (byte)(local_58[1] << 4);
          }
          uVar6 = (uVar6 + lVar5) - 1;
        }
switchD_00103e9f_caseD_0:
        *out_bytes = uVar6;
        return iVar7;
      }
      sVar9 = 0;
      uVar6 = 0;
      lVar5 = 0;
      do {
        cVar3 = def->dictionary[*(byte *)((long)in + sVar9)];
        if (cVar3 < '\0') {
          if (cVar3 == -1) {
            return -1;
          }
        }
        else {
          local_58[lVar5] = (int)cVar3;
          if (lVar5 == 1) {
            *pbVar4 = (byte)(local_58[0] << 4) | (byte)local_58[1];
            pbVar4 = pbVar4 + 1;
            uVar6 = uVar6 + 1;
            lVar5 = 0;
          }
          else {
            lVar5 = 1;
          }
        }
        sVar9 = sVar9 + 1;
      } while (in_bytes != sVar9);
      *out_bytes = uVar6;
    }
  }
  return 0;
}

Assistant:

int
zt_base_decode(zt_base_definition_t * def, const void * in, size_t in_bytes, void ** out, size_t * out_bytes) {
    const unsigned char * inp;
    unsigned char       * outp;
    size_t                lcount = 0;
    size_t                ocount = 0;
    size_t                mod = 0;
	ssize_t               i;

    if (!_valid_dictionary_p(def)) {
        return -1;
    }

    if (!out_bytes) {
        return -1;
    }

    if (!in || !in_bytes) {
        *out_bytes = 0;
        return 0;
    }

    inp  = (unsigned char *)in;

    /* strip any follow on pad chars */
    for (i=in_bytes-1; i > 0; i--) {
        if (inp[i] != def->pad) {
            i = in_bytes - 1 - i;
            break;
        }
    }

    lcount = (in_bytes-i) / def->ogroups; /* number of whole input groups */
    mod = ((in_bytes-i) % def->ogroups); /* partial inputs */
    ocount = (lcount * def->igroups) + mod; /* total output bytes */

    if (out == NULL) {
        *out_bytes = ocount;
        return 0;
    }

    if (*out != NULL && *out_bytes < ocount) {
        *out_bytes = ocount;
        return -2;
    }

    outp = *((unsigned char **)out);

    if ((outp == NULL && *out_bytes == 0)) {
        /* dynamically allocate the buffer */
        if (!(outp = zt_calloc(unsigned char, ocount+1))) {
            return -1;
        }

        *out = outp;
        *out_bytes = ocount;
    }

    switch(def->base) {
        case 64:
            return _decode64(def, inp, in_bytes, outp, out_bytes);
            break;
        case 32:
            return _decode32(def, inp, in_bytes, outp, out_bytes);
            break;
        case 16:
            return _decode16(def, inp, in_bytes, outp, out_bytes);
            break;
        default:
            break;
    }

    return -1;
}